

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void __thiscall SimpleLoggerMgr::sleepFlusher(SimpleLoggerMgr *this,size_t ms)

{
  long lVar1;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_30;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  
  local_30._M_device = &this->cvFlusherLock;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  lVar1 = std::chrono::_V2::steady_clock::now();
  local_20.__d.__r = (duration)(ms * 1000000 + lVar1);
  std::condition_variable::__wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (&this->cvFlusher,&local_30,&local_20);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void SimpleLoggerMgr::sleepFlusher(size_t ms) {
    std::unique_lock<std::mutex> l(cvFlusherLock);
    cvFlusher.wait_for(l, std::chrono::milliseconds(ms));
}